

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  string *in_RDX;
  AssertionResult *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *in_stack_fffffffffffffea8;
  LazyExpression *this_00;
  RunContext *this_01;
  AssertionInfo *in_stack_fffffffffffffec8;
  AssertionResult *in_stack_fffffffffffffed0;
  OfType in_stack_fffffffffffffedc;
  AssertionResultData *in_stack_fffffffffffffee0;
  LazyExpression local_88;
  AssertionResult *in_stack_ffffffffffffffc8;
  RunContext *in_stack_ffffffffffffffd0;
  
  AssertionInfo::operator=(&in_RDI->m_info,in_stack_fffffffffffffea8);
  this_00 = &local_88;
  LazyExpression::LazyExpression(this_00,false);
  this_01 = (RunContext *)&stack0xffffffffffffff88;
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
             (LazyExpression *)in_stack_fffffffffffffed0);
  std::__cxx11::string::operator=((string *)this_01,in_RDX);
  AssertionResult::AssertionResult
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(AssertionResultData *)this_01);
  assertionEnded(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  populateReaction(this_01,(AssertionReaction *)this_00);
  AssertionResult::~AssertionResult(in_RDI);
  AssertionResultData::~AssertionResultData((AssertionResultData *)in_RDI);
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string const& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
        populateReaction( reaction );
    }